

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O1

int tpm_socket_send(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  bool bVar1;
  LOGGER_LOG p_Var2;
  ssize_t sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pIterator;
  uint uVar7;
  
  if ((tpm_bytes == (uchar *)0x0 || handle == (TPM_SOCKET_HANDLE)0x0) || bytes_len == 0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x124;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_send",0x123,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,(ulong)bytes_len);
    }
  }
  else {
    iVar4 = 0;
    uVar7 = 0;
    uVar5 = bytes_len;
    if (0 < (int)bytes_len) {
      do {
        sVar3 = send(handle->socket_conn,tpm_bytes,(ulong)uVar5,0);
        uVar7 = (uint)sVar3;
        if ((int)uVar7 < 1) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                      ,"send_socket_bytes",0x89,1,"Failure sending packet.");
          }
          break;
        }
        tpm_bytes = tpm_bytes + (uVar7 & 0x7fffffff);
        uVar6 = uVar5 - uVar7;
        bVar1 = (int)uVar7 <= (int)uVar5;
        uVar5 = uVar6;
      } while (uVar6 != 0 && bVar1);
    }
    if ((int)uVar7 < (int)bytes_len) {
      p_Var2 = xlogging_get_log_function();
      iVar4 = 0x92;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"send_socket_bytes",0x91,1,"sent byte amoutn is less than desired send amount.");
      }
    }
  }
  return iVar4;
}

Assistant:

int tpm_socket_send(TPM_SOCKET_HANDLE handle, const unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        result = send_socket_bytes(handle, tpm_bytes, bytes_len);
    }
    return result;
}